

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O2

int CfdAddMultisigSignDataToDer
              (void *handle,void *multisign_handle,char *signature,int sighash_type,
              bool sighash_anyone_can_pay,char *related_pubkey)

{
  bool bVar1;
  int iVar2;
  CfdException *this;
  string local_110;
  ByteData signature_der;
  ByteData signature_bytes;
  SigHashType local_c0;
  SigHashType sighashtype;
  SignParameter param;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(signature);
  if (!bVar1) {
    cfd::core::SigHashType::Create(&sighashtype,(uint8_t)sighash_type,sighash_anyone_can_pay,false);
    std::__cxx11::string::string((string *)&param,signature,(allocator *)&local_110);
    cfd::core::ByteData::ByteData(&signature_bytes,(string *)&param);
    std::__cxx11::string::~string((string *)&param);
    cfd::core::SigHashType::SigHashType(&local_c0,&sighashtype);
    cfd::SignParameter::SignParameter(&param,&signature_bytes,true,&local_c0);
    cfd::SignParameter::ConvertToSignature(&signature_der,&param);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_110,&signature_der);
    iVar2 = CfdAddMultisigSignData
                      (handle,multisign_handle,local_110._M_dataplus._M_p,related_pubkey);
    std::__cxx11::string::~string((string *)&local_110);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&signature_der);
    cfd::SignParameter::~SignParameter(&param);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&signature_bytes);
    return iVar2;
  }
  param.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "cfdcapi_transaction.cpp";
  param.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0x7ad;
  param.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = "CfdAddMultisigSignDataToDer";
  cfd::core::logger::warn<>((CfdSourceLocation *)&param,"signature is null or empty.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&param,"Failed to parameter. signature is null or empty.",
             (allocator *)&local_110);
  cfd::core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)&param);
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddMultisigSignDataToDer(
    void* handle, void* multisign_handle, const char* signature,
    int sighash_type, bool sighash_anyone_can_pay,
    const char* related_pubkey) {
  try {
    cfd::Initialize();
    if (IsEmptyString(signature)) {
      warn(CFD_LOG_SOURCE, "signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null or empty.");
    }

    // encode to der
    SigHashType sighashtype = SigHashType::Create(
        static_cast<uint8_t>(sighash_type), sighash_anyone_can_pay);
    ByteData signature_bytes = ByteData(std::string(signature));
    SignParameter param(signature_bytes, true, sighashtype);
    ByteData signature_der = param.ConvertToSignature();

    return CfdAddMultisigSignData(
        handle, multisign_handle, signature_der.GetHex().c_str(),
        related_pubkey);
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}